

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialized_message.h
# Opt level: O2

void __thiscall
miniros::SerializedMessage::SerializedMessage
          (SerializedMessage *this,shared_array_uint8_t *buf,size_t num_bytes)

{
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this,
             &buf->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>);
  this->num_bytes = num_bytes;
  this->message_start =
       (buf->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->type_info = (type_info *)0x0;
  return;
}

Assistant:

SerializedMessage(shared_array_uint8_t buf, size_t num_bytes)
  : buf(buf)
  , num_bytes(num_bytes)
  , message_start(buf ? buf.get() : 0)
  , type_info(0)
  { }